

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O2

uoffset64_t __thiscall
flatbuffers::FlatBufferBuilderImpl<true>::ReferTo(FlatBufferBuilderImpl<true> *this,uoffset64_t off)

{
  unsigned_long uVar1;
  
  Align(this,8);
  uVar1 = ReferTo<unsigned_long>(this,off,(this->buf_).size_);
  return uVar1;
}

Assistant:

uoffset64_t ReferTo(uoffset64_t off) {
    // Align to ensure GetSize() below is correct.
    Align(sizeof(uoffset64_t));
    // 64-bit offsets are relative to tail of the whole buffer
    return ReferTo(off, GetSize());
  }